

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_server_handle_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,void *input,
              size_t inlen,ptls_handshake_properties_t *properties)

{
  size_t sVar1;
  undefined1 local_90 [8];
  st_ptls_record_t rec;
  st_ptls_raw_message_emitter_t emitter;
  size_t inlen_local;
  void *input_local;
  size_t in_epoch_local;
  size_t *epoch_offsets_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  if ((tls->field_0x160 & 1) == 0) {
    __assert_fail("tls->is_server",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x14af,
                  "int ptls_server_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
                 );
  }
  local_90[0] = '\x16';
  local_90._2_2_ = 0;
  rec._0_8_ = inlen;
  rec.length = (size_t)input;
  rec.fragment = (uint8_t *)sendbuf;
  if (input != (void *)0x0) {
    sVar1 = ptls_get_read_epoch(tls);
    if (sVar1 == in_epoch) {
      tls_local._4_4_ =
           handle_handshake_record
                     (tls,handle_server_handshake_message,(ptls_message_emitter_t *)&rec.fragment,
                      (st_ptls_record_t *)local_90,properties);
    }
    else {
      tls_local._4_4_ = 10;
    }
    return tls_local._4_4_;
  }
  __assert_fail("input",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                ,0x14b5,
                "int ptls_server_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
               );
}

Assistant:

int ptls_server_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                               size_t inlen, ptls_handshake_properties_t *properties)
{
    assert(tls->is_server);

    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    assert(input);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    return handle_handshake_record(tls, handle_server_handshake_message, &emitter.super, &rec, properties);
}